

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.h
# Opt level: O2

Node<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_> *
__thiscall
duckdb_skiplistlib::skip_list::
Node<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>::insert
          (Node<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
           *this,pair<unsigned_long,_long> *value)

{
  SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
  *val;
  pointer pNVar1;
  Node<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_> *pNVar2;
  ulong uVar3;
  pointer pNVar4;
  size_t *psVar5;
  pointer pNVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long *plVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  
  if (value->second < (this->_value).second) {
    pNVar2 = (Node<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
              *)0x0;
  }
  else {
    val = &this->_nodeRefs;
    lVar7 = (long)(this->_nodeRefs)._nodes.
                  super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->_nodeRefs)._nodes.
                  super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    lVar12 = -(lVar7 >> 4);
    do {
      lVar12 = lVar12 + 1;
      lVar8 = lVar7 + -0x10;
      if (lVar12 == 1) {
        pNVar2 = _Pool::Allocate(this->_pool,value);
        uVar13 = 0;
        goto LAB_005d9ea3;
      }
      pNVar2 = *(Node<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
                 **)((long)&(val->_nodes).
                            super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[-1].pNode + lVar7);
      lVar7 = lVar8;
    } while ((pNVar2 == (Node<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
                         *)0x0) ||
            (pNVar2 = insert(pNVar2,value),
            pNVar2 == (Node<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
                       *)0x0));
    uVar13 = -lVar12;
LAB_005d9ea3:
    uVar3 = (pNVar2->_nodeRefs)._swapLevel;
    pNVar4 = (pNVar2->_nodeRefs)._nodes.
             super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pNVar6 = (pNVar2->_nodeRefs)._nodes.
             super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar11 = (long)pNVar6 - (long)pNVar4 >> 4;
    pNVar1 = (val->_nodes).
             super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (uVar3 < uVar11) {
      if (uVar13 < uVar3) {
        pNVar4[uVar3].width = pNVar4[uVar3].width + pNVar1[uVar13].width;
        uVar13 = uVar13 + 1;
      }
      uVar9 = (long)(this->_nodeRefs)._nodes.
                    super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar1 >> 4;
      if (uVar11 < uVar9) {
        uVar9 = uVar11;
      }
      uVar11 = uVar13 << 4 | 8;
      for (; uVar13 < uVar9; uVar13 = uVar13 + 1) {
        pNVar6 = (val->_nodes).
                 super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(long *)((long)&pNVar6->pNode + uVar11) =
             (*(long *)((long)&pNVar6->pNode + uVar11) - *(long *)((long)&pNVar4->pNode + uVar11)) +
             1;
        SwappableNodeRefStack<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
        ::swap(&pNVar2->_nodeRefs,val);
        uVar3 = (pNVar2->_nodeRefs)._swapLevel;
        pNVar4 = (pNVar2->_nodeRefs)._nodes.
                 super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pNVar6 = (pNVar2->_nodeRefs)._nodes.
                 super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (uVar3 < (ulong)((long)pNVar6 - (long)pNVar4 >> 4)) {
          pNVar4[uVar3].width =
               *(size_t *)
                ((long)&((val->_nodes).
                         super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->pNode + uVar11);
        }
        uVar11 = uVar11 + 0x10;
      }
      if ((ulong)((long)pNVar6 - (long)pNVar4 >> 4) <= uVar3) {
        pNVar4 = (this->_nodeRefs)._nodes.
                 super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pNVar6 = (this->_nodeRefs)._nodes.
                 super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        plVar10 = (long *)((long)&pNVar4->pNode + uVar11);
        for (; pNVar2 = this, uVar13 < (ulong)((long)pNVar6 - (long)pNVar4 >> 4);
            uVar13 = uVar13 + 1) {
          *plVar10 = *plVar10 + 1;
          plVar10 = plVar10 + 2;
        }
      }
    }
    else {
      pNVar4 = (this->_nodeRefs)._nodes.
               super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      psVar5 = &pNVar1[uVar11].width;
      for (; pNVar2 = this, uVar11 < (ulong)((long)pNVar4 - (long)pNVar1 >> 4); uVar11 = uVar11 + 1)
      {
        *psVar5 = *psVar5 + 1;
        psVar5 = psVar5 + 2;
      }
    }
  }
  return pNVar2;
}

Assistant:

size_t height() const { return _nodeRefs.height(); }